

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_upkeep(Curl_easy *data)

{
  _Bool _Var1;
  CURLcode CVar2;
  
  CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
  if ((data != (Curl_easy *)0x0) && (data->magic == 0xc0dedbad)) {
    _Var1 = Curl_is_in_callback(data);
    if (!_Var1) {
      CVar2 = Curl_cpool_upkeep(data);
      return CVar2;
    }
    CVar2 = CURLE_RECURSIVE_API_CALL;
  }
  return CVar2;
}

Assistant:

CURLcode curl_easy_upkeep(struct Curl_easy *data)
{
  /* Verify that we got an easy handle we can work with. */
  if(!GOOD_EASY_HANDLE(data))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(Curl_is_in_callback(data))
    return CURLE_RECURSIVE_API_CALL;

  /* Use the common function to keep connections alive. */
  return Curl_cpool_upkeep(data);
}